

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

glist_t fsg_model_null_trans_closure(fsg_model_t *fsg,glist_t nulls)

{
  uint uVar1;
  hash_table_t *phVar2;
  int32 *piVar3;
  void *pvVar4;
  bool bVar5;
  int32 iVar6;
  hash_iter_t *phVar7;
  fsg_link_t *ptr;
  long lVar8;
  undefined8 in_R8;
  gnode_s *pgVar9;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0xbe,"Computing transitive closure for null transitions\n");
  if (nulls == (glist_t)0x0) {
    if (fsg->n_state < 1) {
      nulls = (glist_t)0x0;
    }
    else {
      lVar8 = 0;
      nulls = (glist_t)0x0;
      do {
        phVar2 = fsg->trans[lVar8].null_trans;
        if (phVar2 != (hash_table_t *)0x0) {
          for (phVar7 = hash_table_iter(phVar2); phVar7 != (hash_iter_t *)0x0;
              phVar7 = hash_table_iter_next(phVar7)) {
            nulls = glist_add_ptr(nulls,phVar7->ent->val);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < fsg->n_state);
    }
  }
  uVar1 = 0;
  do {
    if (nulls == (glist_t)0x0) {
      nulls = (glist_t)0x0;
      break;
    }
    bVar5 = false;
    pgVar9 = nulls;
    do {
      piVar3 = (int32 *)(pgVar9->data).ptr;
      if (-1 < piVar3[3]) {
        __assert_fail("tl1->wid < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0xde,"glist_t fsg_model_null_trans_closure(fsg_model_t *, glist_t)");
      }
      phVar2 = fsg->trans[piVar3[1]].null_trans;
      if (phVar2 != (hash_table_t *)0x0) {
        for (phVar7 = hash_table_iter(phVar2); phVar7 != (hash_iter_t *)0x0;
            phVar7 = hash_table_iter_next(phVar7)) {
          pvVar4 = phVar7->ent->val;
          iVar6 = fsg_model_tag_trans_add
                            (fsg,*piVar3,*(int32 *)((long)pvVar4 + 4),
                             *(int *)((long)pvVar4 + 8) + piVar3[2],(int32)in_R8);
          if ((-1 < iVar6) && (bVar5 = true, iVar6 != 0)) {
            ptr = fsg_model_null_trans(fsg,*piVar3,*(int32 *)((long)pvVar4 + 4));
            nulls = glist_add_ptr(nulls,ptr);
            uVar1 = uVar1 + 1;
            bVar5 = true;
          }
        }
      }
      pgVar9 = pgVar9->next;
    } while (pgVar9 != (gnode_s *)0x0);
  } while (bVar5);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0xfc,"%d null transitions added\n",(ulong)uVar1);
  return nulls;
}

Assistant:

glist_t
fsg_model_null_trans_closure(fsg_model_t * fsg, glist_t nulls)
{
    gnode_t *gn1;
    int updated;
    fsg_link_t *tl1, *tl2;
    int32 k, n;

    E_INFO("Computing transitive closure for null transitions\n");

    /* If our caller didn't give us a list of null-transitions,
       make such a list. Just loop through all the FSG states, 
       and all the null-transitions in that state (which are kept in
       their own hash table). */
    if (nulls == NULL) {
        int i;
        for (i = 0; i < fsg->n_state; ++i) {
            hash_iter_t *itor;
            hash_table_t *null_trans = fsg->trans[i].null_trans;
            if (null_trans == NULL)
                continue;
            for (itor = hash_table_iter(null_trans);
                 itor != NULL; itor = hash_table_iter_next(itor)) {
                nulls = glist_add_ptr(nulls, hash_entry_val(itor->ent));
            }
        }
    }

    /*
     * Probably not the most efficient closure implementation, in general, but
     * probably reasonably efficient for a sparse null transition matrix.
     */
    n = 0;
    do {
        updated = FALSE;

        for (gn1 = nulls; gn1; gn1 = gnode_next(gn1)) {
            hash_iter_t *itor;

            tl1 = (fsg_link_t *) gnode_ptr(gn1);
            assert(tl1->wid < 0);

            if (fsg->trans[tl1->to_state].null_trans == NULL)
                continue;

            for (itor =
                 hash_table_iter(fsg->trans[tl1->to_state].null_trans);
                 itor; itor = hash_table_iter_next(itor)) {

                tl2 = (fsg_link_t *) hash_entry_val(itor->ent);

                k = fsg_model_null_trans_add(fsg,
                                             tl1->from_state,
                                             tl2->to_state,
                                             tl1->logs2prob +
                                             tl2->logs2prob);
                if (k >= 0) {
                    updated = TRUE;
                    if (k > 0) {
                        nulls = glist_add_ptr(nulls, (void *)
                                              fsg_model_null_trans
                                              (fsg, tl1->from_state,
                                               tl2->to_state));
                        n++;
                    }
                }
            }
        }
    } while (updated);

    E_INFO("%d null transitions added\n", n);

    return nulls;
}